

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_vepu2_v2.c
# Opt level: O0

MPP_RET vp8e_vpu_frame_start(void *hal)

{
  void *__s;
  long lVar1;
  uint local_38;
  int local_34;
  RK_S32 j;
  Vp8eVepu2Reg_t *regs;
  Vp8eHwCfg *hw_cfg;
  HalVp8eCtx *ctx;
  RK_S32 i;
  void *hal_local;
  
  __s = *(void **)((long)hal + 0x58);
  memset(__s,0,0x2e0);
  if (*(int *)((long)hal + 0x160) == 0) {
    local_38 = *(uint *)((long)__s + 0x1b4) & 0xfeff;
  }
  else {
    local_38 = *(uint *)((long)__s + 0x1b4) & 0xffff | 0x100;
  }
  *(uint *)((long)__s + 0x1b4) = *(uint *)((long)__s + 0x1b4) & 0xffff0000 | local_38;
  *(undefined4 *)((long)__s + 0xd8) = 0x1000;
  if (*(uint *)((long)hal + 0x18c) < 4) {
    *(undefined4 *)((long)__s + 0x1a4) = 0xfc000000;
  }
  else if (*(uint *)((long)hal + 0x18c) < 7) {
    *(undefined4 *)((long)__s + 0x1a4) = 0xfc000000;
  }
  else {
    *(undefined4 *)((long)__s + 0x1a4) = 0x3c000000;
  }
  *(undefined4 *)((long)__s + 0x134) = *(undefined4 *)((long)hal + 0x194);
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0x4d,*(RK_U32 *)((long)hal + 0x198));
  *(undefined4 *)((long)__s + 0x138) = *(undefined4 *)((long)hal + 0x1ac);
  *(uint *)((long)__s + 0x128) =
       *(uint *)((long)__s + 0x128) & 0xfffffffe | (uint)(*(int *)((long)hal + 0x1ac) != 0);
  *(uint *)((long)__s + 0x1b4) =
       *(uint *)((long)__s + 0x1b4) & 0xfeffffff | (uint)(*(int *)((long)hal + 0x374) != 0) << 0x18;
  *(undefined4 *)((long)__s + 0xe0) = *(undefined4 *)((long)hal + 0x1c4);
  *(undefined4 *)((long)__s + 0xe4) = *(undefined4 *)((long)hal + 0x1cc);
  *(undefined4 *)((long)__s + 0xfc) = *(undefined4 *)((long)hal + 0x1bc);
  *(undefined4 *)((long)__s + 0x100) = *(undefined4 *)((long)hal + 0x1c0);
  *(undefined4 *)((long)__s + 0xc0) = *(undefined4 *)((long)hal + 0x1d4);
  if (*(int *)((long)hal + 0x1d8) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0x30,*(RK_U32 *)((long)hal + 0x1d8));
  }
  *(undefined4 *)((long)__s + 0xc4) = *(undefined4 *)((long)hal + 0x1dc);
  if (*(int *)((long)hal + 0x1e0) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0x31,*(RK_U32 *)((long)hal + 0x1e0));
  }
  *(undefined4 *)((long)__s + 200) = *(undefined4 *)((long)hal + 0x1e4);
  if (*(int *)((long)hal + 0x1e8) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0x32,*(RK_U32 *)((long)hal + 0x1e8));
  }
  *(uint *)((long)__s + 0x1b4) =
       *(uint *)((long)__s + 0x1b4) & 0xffff0000 | *(uint *)((long)__s + 0x1b4) & 0xffff | 0x400;
  *(uint *)((long)__s + 0x1b4) =
       *(uint *)((long)__s + 0x1b4) & 0xfffeffff | (*(uint *)((long)hal + 0x1b0) & 1) << 0x10;
  *(uint *)((long)__s + 0x1b4) =
       *(uint *)((long)__s + 0x1b4) & 0xffefffff | (*(uint *)((long)hal + 0x1b4) & 1) << 0x14;
  *(uint *)((long)__s + 0x19c) =
       *(uint *)((long)__s + 0x19c) & 0xfffe00ff | (*(uint *)((long)hal + 0x168) & 0x1ff) << 8;
  *(uint *)((long)__s + 0x19c) =
       *(uint *)((long)__s + 0x19c) & 0xe00fffff | (*(uint *)((long)hal + 0x164) & 0x1ff) << 0x14;
  *(uint *)((long)__s + 0x19c) =
       *(uint *)((long)__s + 0x19c) & 0xffffff3f | (*(uint *)((long)hal + 0x170) & 3) << 6;
  *(uint *)((long)__s + 0x19c) =
       *(uint *)((long)__s + 0x19c) & 0xffffffcf | (*(uint *)((long)hal + 0x174) & 3) << 4;
  *(uint *)((long)__s + 0xf4) =
       *(uint *)((long)__s + 0xf4) & 0xff8fffff | (*(uint *)((long)hal + 0x2fc) & 7) << 0x14;
  *(uint *)((long)__s + 0xf4) =
       *(uint *)((long)__s + 0xf4) & 0xfff8ffff | (*(uint *)((long)hal + 0x2f8) & 7) << 0x10;
  *(uint *)((long)__s + 0xf4) =
       *(uint *)((long)__s + 0xf4) & 0xffffc000 | *(uint *)((long)hal + 0x178) & 0x3fff;
  *(uint *)((long)__s + 0xf0) =
       *(uint *)((long)__s + 0xf0) & 0xffffffcf | (*(uint *)((long)hal + 0x17c) & 3) << 4;
  *(uint *)((long)__s + 0xf0) =
       *(uint *)((long)__s + 0xf0) & 0xfffffff0 | *(uint *)((long)hal + 0x180) & 0xf;
  *(uint *)((long)__s + 0x128) =
       *(uint *)((long)__s + 0x128) & 0xffffff0f | (*(uint *)((long)hal + 0x18c) & 0xf) << 4;
  *(uint *)((long)__s + 0x128) =
       *(uint *)((long)__s + 0x128) & 0xfffffff3 | (*(uint *)((long)hal + 400) & 3) << 2;
  *(uint *)((long)__s + 0xec) =
       *(uint *)((long)__s + 0xec) & 0xffefffff | (*(uint *)((long)hal + 0x188) & 1) << 0x14;
  *(uint *)((long)__s + 300) =
       *(uint *)((long)__s + 300) & 0xffff | *(int *)((long)hal + 0x310) << 0x10;
  *(uint *)((long)__s + 300) =
       *(uint *)((long)__s + 300) & 0xffff0000 | *(uint *)((long)hal + 0x318) & 0xffff;
  *(uint *)((long)__s + 0xec) =
       *(uint *)((long)__s + 0xec) & 0xefffffff | (*(uint *)((long)hal + 0x300) & 1) << 0x1c;
  *(uint *)((long)__s + 0xec) =
       *(uint *)((long)__s + 0xec) & 0xfcffffff | (*(uint *)((long)hal + 0x184) & 3) << 0x18;
  *(uint *)((long)__s + 0xf0) =
       *(uint *)((long)__s + 0xf0) & 0xffff00ff | (*(uint *)((long)hal + 0x31c) & 0xff) << 8;
  *(uint *)((long)__s + 0x18c) =
       *(uint *)((long)__s + 0x18c) & 0xfffffffe | *(uint *)((long)hal + 0x4f0) & 1;
  *(uint *)((long)__s + 0x1ac) =
       *(uint *)((long)__s + 0x1ac) & 0xc00fffff | (*(uint *)((long)hal + 0x4f4) & 0x3ff) << 0x14;
  *(uint *)((long)__s + 0x1ac) =
       *(uint *)((long)__s + 0x1ac) & 0xfff003ff | (*(uint *)((long)hal + 0x4f8) & 0x3ff) << 10;
  *(uint *)((long)__s + 0x1ac) =
       *(uint *)((long)__s + 0x1ac) & 0xfffffc00 | *(uint *)((long)hal + 0x4fc) & 0x3ff;
  *(uint *)((long)__s + 0x198) =
       *(uint *)((long)__s + 0x198) & 0xfff007ff | (*(uint *)((long)hal + 0x500) & 0x1ff) << 0xb;
  *(uint *)((long)__s + 0x198) =
       *(uint *)((long)__s + 0x198) & 0xff0fffff | (*(uint *)((long)hal + 0x4ec) & 0xf) << 0x14;
  *(undefined4 *)((long)__s + 0xcc) = *(undefined4 *)((long)hal + 0x1a4);
  *(undefined4 *)((long)__s + 0xd0) = *(undefined4 *)((long)hal + 0x1a8);
  *(undefined4 *)((long)__s + 0xd4) = *(undefined4 *)((long)hal + 0x19c);
  *(undefined4 *)((long)__s + 0x130) = *(undefined4 *)((long)hal + 0x1c8);
  *(undefined4 *)((long)__s + 0x1a8) = *(undefined4 *)((long)hal + 0x1d0);
  *(uint *)((long)__s + 400) =
       *(uint *)((long)__s + 400) & 0xffffc000 | *(ushort *)((long)hal + 0x3d4) & 0x3fff;
  *(uint *)((long)__s + 0x104) =
       *(uint *)((long)__s + 0x104) & 0xffffc000 | *(ushort *)((long)hal + 0x3dc) & 0x3fff;
  *(uint *)((long)__s + 0x108) =
       *(uint *)((long)__s + 0x108) & 0xffffc000 | *(ushort *)((long)hal + 0x3e4) & 0x3fff;
  *(uint *)((long)__s + 0x10c) =
       *(uint *)((long)__s + 0x10c) & 0xffffc000 | *(ushort *)((long)hal + 0x3ec) & 0x3fff;
  *(uint *)((long)__s + 0x110) =
       *(uint *)((long)__s + 0x110) & 0xffffc000 | *(ushort *)((long)hal + 0x3f4) & 0x3fff;
  *(uint *)((long)__s + 0x114) =
       *(uint *)((long)__s + 0x114) & 0xffffc000 | *(ushort *)((long)hal + 0x3fc) & 0x3fff;
  *(uint *)((long)__s + 400) =
       *(uint *)((long)__s + 400) & 0xff803fff | (*(ushort *)((long)hal + 0x404) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x104) =
       *(uint *)((long)__s + 0x104) & 0xff803fff | (*(ushort *)((long)hal + 0x40c) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x108) =
       *(uint *)((long)__s + 0x108) & 0xff803fff | (*(ushort *)((long)hal + 0x414) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x10c) =
       *(uint *)((long)__s + 0x10c) & 0xff803fff | (*(ushort *)((long)hal + 0x41c) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x110) =
       *(uint *)((long)__s + 0x110) & 0xff803fff | (*(ushort *)((long)hal + 0x424) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x114) =
       *(uint *)((long)__s + 0x114) & 0xff803fff | (*(ushort *)((long)hal + 0x42c) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 400) =
       *(uint *)((long)__s + 400) & 0x807fffff | (uint)*(byte *)((long)hal + 0x434) << 0x17;
  *(uint *)((long)__s + 0x104) =
       *(uint *)((long)__s + 0x104) & 0x807fffff | (uint)*(byte *)((long)hal + 0x438) << 0x17;
  *(uint *)((long)__s + 0x108) =
       *(uint *)((long)__s + 0x108) & 0x807fffff | (uint)*(byte *)((long)hal + 0x43c) << 0x17;
  *(uint *)((long)__s + 0x10c) =
       *(uint *)((long)__s + 0x10c) & 0x807fffff | (uint)*(byte *)((long)hal + 0x440) << 0x17;
  *(uint *)((long)__s + 0x110) =
       *(uint *)((long)__s + 0x110) & 0x807fffff | (uint)*(byte *)((long)hal + 0x444) << 0x17;
  *(uint *)((long)__s + 0x114) =
       *(uint *)((long)__s + 0x114) & 0x807fffff | (uint)*(byte *)((long)hal + 0x448) << 0x17;
  *(uint *)((long)__s + 0x118) =
       *(uint *)((long)__s + 0x118) & 0xffffff00 | *(ushort *)((long)hal + 0x44c) & 0xff;
  *(uint *)((long)__s + 0x118) =
       *(uint *)((long)__s + 0x118) & 0xfffe00ff | (*(ushort *)((long)hal + 0x454) & 0x1ff) << 8;
  *(uint *)((long)__s + 0x118) =
       *(uint *)((long)__s + 0x118) & 0xfc01ffff | (*(ushort *)((long)hal + 0x45c) & 0x1ff) << 0x11;
  *(uint *)((long)__s + 0x11c) =
       *(uint *)((long)__s + 0x11c) & 0xfffffe00 | *(ushort *)((long)hal + 0x464) & 0x1ff;
  *(uint *)((long)__s + 0x11c) =
       *(uint *)((long)__s + 0x11c) & 0xfffe01ff | (*(ushort *)((long)hal + 0x46c) & 0xff) << 9;
  *(uint *)((long)__s + 0x11c) =
       *(uint *)((long)__s + 0x11c) & 0xfc01ffff | (*(ushort *)((long)hal + 0x474) & 0x1ff) << 0x11;
  *(uint *)((long)__s + 0x118) =
       *(uint *)((long)__s + 0x118) & 0xf3ffffff | (*(uint *)((long)hal + 0x484) & 3) << 0x1a;
  *(uint *)((long)__s + 0x11c) =
       *(uint *)((long)__s + 0x11c) & 0xf3ffffff | (*(uint *)((long)hal + 0x488) & 3) << 0x1a;
  *(uint *)((long)__s + 0x11c) =
       *(uint *)((long)__s + 0x11c) & 0xefffffff | (*(uint *)((long)hal + 0x48c) & 1) << 0x1c;
  *(undefined4 *)((long)__s + 0x120) = *(undefined4 *)((long)hal + 0x490);
  *(uint *)((long)__s + 0x124) =
       *(uint *)((long)__s + 0x124) & 0xffffe0ff | (*(uint *)((long)hal + 0x494) & 0x1f) << 8;
  *(uint *)((long)__s + 0x124) =
       *(uint *)((long)__s + 0x124) & 0xffffff00 | *(uint *)((long)hal + 0x498) & 0xff;
  *(uint *)((long)__s + 0x124) =
       *(uint *)((long)__s + 0x124) & 0xffe07fff | (*(uint *)((long)hal + 0x4a0) & 0x3f) << 0xf;
  *(uint *)((long)__s + 0x124) =
       *(uint *)((long)__s + 0x124) & 0xffffff | *(int *)((long)hal + 800) << 0x18;
  *(uint *)((long)__s + 0x124) =
       *(uint *)((long)__s + 0x124) & 0xff1fffff | (*(uint *)((long)hal + 0x4b0) & 7) << 0x15;
  *(uint *)((long)__s + 0x124) =
       *(uint *)((long)__s + 0x124) & 0xffff9fff | (*(uint *)((long)hal + 0x49c) & 3) << 0xd;
  *(uint *)((long)__s + 0xf0) =
       *(uint *)((long)__s + 0xf0) & 0xffc0ffff | (*(uint *)((long)hal + 0x1a0) & 0x3f) << 0x10;
  *(undefined4 *)((long)__s + 0x13c) = *(undefined4 *)((long)hal + 0x304);
  *(uint *)((long)__s + 0x178) =
       *(uint *)((long)__s + 0x178) & 0xffffff3f | (*(uint *)((long)hal + 0x308) & 3) << 6;
  *(uint *)((long)__s + 0x18c) =
       *(uint *)((long)__s + 0x18c) & 0xfffff801 | (*(uint *)((long)hal + 0x324) & 0x3ff) << 1;
  *(uint *)((long)__s + 0x18c) =
       *(uint *)((long)__s + 0x18c) & 0x801fffff | (*(uint *)((long)hal + 0x328) & 0x3ff) << 0x15;
  *(uint *)((long)__s + 0x18c) =
       *(uint *)((long)__s + 0x18c) & 0xffe007ff | (*(uint *)((long)hal + 0x32c) & 0x3ff) << 0xb;
  *(undefined4 *)((long)__s + 0x144) = *(undefined4 *)((long)hal + 0x378);
  *(undefined4 *)((long)__s + 0x140) = *(undefined4 *)((long)hal + 0x374);
  *(uint *)((long)__s + 0x17c) =
       *(uint *)((long)__s + 0x17c) & 0xffff0000 | (uint)*(ushort *)((long)hal + 900);
  *(uint *)((long)__s + 0x17c) =
       *(uint *)((long)__s + 0x17c) & 0xffff | (uint)*(ushort *)((long)hal + 0x386) << 0x10;
  *(uint *)((long)__s + 0x180) =
       *(uint *)((long)__s + 0x180) & 0xffff0000 | (uint)*(ushort *)((long)hal + 0x388);
  *(uint *)((long)__s + 0x180) =
       *(uint *)((long)__s + 0x180) & 0xffff | (uint)*(ushort *)((long)hal + 0x38a) << 0x10;
  *(uint *)((long)__s + 0x184) =
       *(uint *)((long)__s + 0x184) & 0xffff0000 | (uint)*(ushort *)((long)hal + 0x38c);
  *(uint *)((long)__s + 0x188) =
       *(uint *)((long)__s + 0x188) & 0xffffffe0 | *(byte *)((long)hal + 0x38e) & 0x1f;
  *(uint *)((long)__s + 0x188) =
       *(uint *)((long)__s + 0x188) & 0xffffe0ff | (*(byte *)((long)hal + 0x38f) & 0x1f) << 8;
  *(uint *)((long)__s + 0x188) =
       *(uint *)((long)__s + 0x188) & 0xffe0ffff | (*(byte *)((long)hal + 0x390) & 0x1f) << 0x10;
  *(uint *)((long)__s + 0xbc) =
       *(uint *)((long)__s + 0xbc) & 0xffff | *(int *)((long)hal + 0x334) << 0x10;
  *(uint *)((long)__s + 0xbc) =
       *(uint *)((long)__s + 0xbc) & 0xffff0000 | *(uint *)((long)hal + 0x338) & 0xffff;
  *(uint *)((long)__s + 0xb8) =
       *(uint *)((long)__s + 0xb8) & 0xffff00ff | (*(uint *)((long)hal + 0x340) & 0xff) << 8;
  *(uint *)((long)__s + 0xb8) =
       *(uint *)((long)__s + 0xb8) & 0xffffff00 | *(uint *)((long)hal + 0x348) & 0xff;
  *(uint *)((long)__s + 0xb8) =
       *(uint *)((long)__s + 0xb8) & 0xffffff | *(int *)((long)hal + 0x33c) << 0x18;
  *(uint *)((long)__s + 0xb8) =
       *(uint *)((long)__s + 0xb8) & 0xff00ffff | (*(uint *)((long)hal + 0x344) & 0xff) << 0x10;
  *(uint *)((long)__s + 0x148) =
       *(uint *)((long)__s + 0x148) & 0xffff00ff | (*(uint *)((long)hal + 0x350) & 0xff) << 8;
  *(uint *)((long)__s + 0x148) =
       *(uint *)((long)__s + 0x148) & 0xffffff00 | *(uint *)((long)hal + 0x358) & 0xff;
  *(uint *)((long)__s + 0x148) =
       *(uint *)((long)__s + 0x148) & 0xffffff | *(int *)((long)hal + 0x34c) << 0x18;
  *(uint *)((long)__s + 0x148) =
       *(uint *)((long)__s + 0x148) & 0xff00ffff | (*(uint *)((long)hal + 0x354) & 0xff) << 0x10;
  *(uint *)((long)__s + 0x14c) =
       *(uint *)((long)__s + 0x14c) & 0xffff00ff | (*(uint *)((long)hal + 0x360) & 0xff) << 8;
  *(uint *)((long)__s + 0x14c) =
       *(uint *)((long)__s + 0x14c) & 0xffffff00 | *(uint *)((long)hal + 0x368) & 0xff;
  *(uint *)((long)__s + 0x14c) =
       *(uint *)((long)__s + 0x14c) & 0xffffff | *(int *)((long)hal + 0x35c) << 0x18;
  *(uint *)((long)__s + 0x14c) =
       *(uint *)((long)__s + 0x14c) & 0xff00ffff | (*(uint *)((long)hal + 0x364) & 0xff) << 0x10;
  *(undefined4 *)((long)__s + 0xb0) = *(undefined4 *)((long)hal + 0x394);
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0x2c,*(RK_U32 *)((long)hal + 0x3b4));
  *(undefined4 *)((long)__s + 0xb4) = *(undefined4 *)((long)hal + 0x398);
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0x2d,*(RK_U32 *)((long)hal + 0x3b8));
  *(undefined4 *)((long)__s + 0x1b0) = *(undefined4 *)((long)hal + 0x37c);
  *(uint *)((long)__s + 0x84) =
       *(uint *)((long)__s + 0x84) & 0xfffff000 | *(uint *)((long)hal + 0x4b4) & 0xfff;
  *(uint *)((long)__s + 0x84) =
       *(uint *)((long)__s + 0x84) & 0xf000ffff | (*(uint *)((long)hal + 0x4b8) & 0xfff) << 0x10;
  *(uint *)((long)__s + 0x88) =
       *(uint *)((long)__s + 0x88) & 0xfffff000 | *(uint *)((long)hal + 0x4bc) & 0xfff;
  *(uint *)((long)__s + 0x88) =
       *(uint *)((long)__s + 0x88) & 0xf000ffff | (*(uint *)((long)hal + 0x4c0) & 0xfff) << 0x10;
  for (ctx._4_4_ = 0; ctx._4_4_ < 5; ctx._4_4_ = ctx._4_4_ + 1) {
    *(uint *)((long)__s + (long)ctx._4_4_ * 4 + 0x70) =
         *(uint *)((long)__s + (long)ctx._4_4_ * 4 + 0x70) & 0xfffff000 |
         *(uint *)((long)hal + (long)(ctx._4_4_ << 1) * 4 + 0x4c4) & 0xfff;
    *(uint *)((long)__s + (long)ctx._4_4_ * 4 + 0x70) =
         *(uint *)((long)__s + (long)ctx._4_4_ * 4 + 0x70) & 0xf000ffff |
         (*(uint *)((long)hal + (long)(ctx._4_4_ * 2 + 1) * 4 + 0x4c4) & 0xfff) << 0x10;
  }
  *(uint *)((long)__s + 0x11c) =
       *(uint *)((long)__s + 0x11c) & 0xdfffffff | (*(uint *)((long)hal + 0x47c) & 1) << 0x1d;
  *(uint *)((long)__s + 0x11c) =
       *(uint *)((long)__s + 0x11c) & 0xbfffffff | (*(uint *)((long)hal + 0x480) & 1) << 0x1e;
  *(undefined4 *)((long)__s + 0x6c) = *(undefined4 *)((long)hal + 0x380);
  for (ctx._4_4_ = 0; ctx._4_4_ < 3; ctx._4_4_ = ctx._4_4_ + 1) {
    *(uint *)((long)__s + (long)(ctx._4_4_ * 9) * 4) =
         *(uint *)((long)__s + (long)(ctx._4_4_ * 9) * 4) & 0xffffc000 |
         *(ushort *)((long)hal + (long)(ctx._4_4_ + 1) * 2 + 0x3d4) & 0x3fff;
    *(uint *)((long)__s + (long)(ctx._4_4_ * 9) * 4) =
         *(uint *)((long)__s + (long)(ctx._4_4_ * 9) * 4) & 0xc000ffff |
         (*(ushort *)((long)hal + (long)(ctx._4_4_ + 1) * 2 + 0x3e4) & 0x3fff) << 0x10;
    lVar1 = (long)(ctx._4_4_ * 9 + 1);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xffffc000 |
         *(ushort *)((long)hal + (long)(ctx._4_4_ + 1) * 2 + 0x3f4) & 0x3fff;
    lVar1 = (long)(ctx._4_4_ * 9 + 1);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xc000ffff |
         (*(ushort *)((long)hal + (long)(ctx._4_4_ + 1) * 2 + 0x3dc) & 0x3fff) << 0x10;
    lVar1 = (long)(ctx._4_4_ * 9 + 2);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xffffc000 |
         *(ushort *)((long)hal + (long)(ctx._4_4_ + 1) * 2 + 0x3ec) & 0x3fff;
    lVar1 = (long)(ctx._4_4_ * 9 + 2);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xc000ffff |
         (*(ushort *)((long)hal + (long)(ctx._4_4_ + 1) * 2 + 0x3fc) & 0x3fff) << 0x10;
    lVar1 = (long)(ctx._4_4_ * 9 + 3);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xfffffe00 |
         *(ushort *)((long)hal + (long)(ctx._4_4_ + 1) * 2 + 0x404) & 0x1ff;
    lVar1 = (long)(ctx._4_4_ * 9 + 3);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xfffc01ff |
         (*(ushort *)((long)hal + (long)(ctx._4_4_ + 1) * 2 + 0x414) & 0x1ff) << 9;
    lVar1 = (long)(ctx._4_4_ * 9 + 3);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xf803ffff |
         (*(ushort *)((long)hal + (long)(ctx._4_4_ + 1) * 2 + 0x424) & 0x1ff) << 0x12;
    lVar1 = (long)(ctx._4_4_ * 9 + 4);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xfffffe00 |
         *(ushort *)((long)hal + (long)(ctx._4_4_ + 1) * 2 + 0x40c) & 0x1ff;
    lVar1 = (long)(ctx._4_4_ * 9 + 4);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xfffc01ff |
         (*(ushort *)((long)hal + (long)(ctx._4_4_ + 1) * 2 + 0x41c) & 0x1ff) << 9;
    lVar1 = (long)(ctx._4_4_ * 9 + 4);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xf803ffff |
         (*(ushort *)((long)hal + (long)(ctx._4_4_ + 1) * 2 + 0x42c) & 0x1ff) << 0x12;
    lVar1 = (long)(ctx._4_4_ * 9 + 5);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xffffff00 |
         (uint)*(byte *)((long)hal + (long)(ctx._4_4_ + 1) + 0x434);
    lVar1 = (long)(ctx._4_4_ * 9 + 5);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xffff00ff |
         (uint)*(byte *)((long)hal + (long)(ctx._4_4_ + 1) + 0x43c) << 8;
    lVar1 = (long)(ctx._4_4_ * 9 + 5);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xff00ffff |
         (uint)*(byte *)((long)hal + (long)(ctx._4_4_ + 1) + 0x444) << 0x10;
    lVar1 = (long)(ctx._4_4_ * 9 + 6);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xffffff00 |
         (uint)*(byte *)((long)hal + (long)(ctx._4_4_ + 1) + 0x438);
    lVar1 = (long)(ctx._4_4_ * 9 + 6);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xffff00ff |
         (uint)*(byte *)((long)hal + (long)(ctx._4_4_ + 1) + 0x440) << 8;
    lVar1 = (long)(ctx._4_4_ * 9 + 6);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xff00ffff |
         (uint)*(byte *)((long)hal + (long)(ctx._4_4_ + 1) + 0x448) << 0x10;
    lVar1 = (long)(ctx._4_4_ * 9 + 7);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xffffff00 |
         *(ushort *)((long)hal + (long)(ctx._4_4_ + 1) * 2 + 0x44c) & 0xff;
    lVar1 = (long)(ctx._4_4_ * 9 + 7);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xfffe00ff |
         (*(ushort *)((long)hal + (long)(ctx._4_4_ + 1) * 2 + 0x45c) & 0x1ff) << 8;
    lVar1 = (long)(ctx._4_4_ * 9 + 7);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xfe01ffff |
         (*(ushort *)((long)hal + (long)(ctx._4_4_ + 1) * 2 + 0x46c) & 0xff) << 0x11;
    lVar1 = (long)(ctx._4_4_ * 9 + 7);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0x81ffffff |
         (*(uint *)((long)hal + (long)(ctx._4_4_ + 1) * 4 + 0x4a0) & 0x3f) << 0x19;
    lVar1 = (long)(ctx._4_4_ * 9 + 8);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xfffffe00 |
         *(ushort *)((long)hal + (long)(ctx._4_4_ + 1) * 2 + 0x454) & 0x1ff;
    lVar1 = (long)(ctx._4_4_ * 9 + 8);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xfffc01ff |
         (*(ushort *)((long)hal + (long)(ctx._4_4_ + 1) * 2 + 0x464) & 0x1ff) << 9;
    lVar1 = (long)(ctx._4_4_ * 9 + 8);
    *(uint *)((long)__s + lVar1 * 4) =
         *(uint *)((long)__s + lVar1 * 4) & 0xf803ffff |
         (*(ushort *)((long)hal + (long)(ctx._4_4_ + 1) * 2 + 0x474) & 0x1ff) << 0x12;
  }
  *(uint *)((long)__s + 0xa0) =
       *(uint *)((long)__s + 0xa0) & 0xff80ffff | (*(uint *)((long)hal + 0x504) & 0x7f) << 0x10;
  *(uint *)((long)__s + 0xa8) =
       *(uint *)((long)__s + 0xa8) & 0xffff80ff | (*(uint *)((long)hal + 0x508) & 0x7f) << 8;
  *(uint *)((long)__s + 0xa8) =
       *(uint *)((long)__s + 0xa8) & 0xffffff80 | *(uint *)((long)hal + 0x50c) & 0x7f;
  *(uint *)((long)__s + 0xa8) =
       *(uint *)((long)__s + 0xa8) & 0xff80ffff | (*(uint *)((long)hal + 0x510) & 0x7f) << 0x10;
  *(uint *)((long)__s + 0xa0) =
       *(uint *)((long)__s + 0xa0) & 0x80ffffff | (*(uint *)((long)hal + 0x514) & 0x7f) << 0x18;
  *(uint *)((long)__s + 0xac) =
       *(uint *)((long)__s + 0xac) & 0xffff80ff | (*(uint *)((long)hal + 0x518) & 0x7f) << 8;
  *(uint *)((long)__s + 0xac) =
       *(uint *)((long)__s + 0xac) & 0xffffff80 | *(uint *)((long)hal + 0x51c) & 0x7f;
  *(uint *)((long)__s + 0xac) =
       *(uint *)((long)__s + 0xac) & 0xff80ffff | (*(uint *)((long)hal + 0x520) & 0x7f) << 0x10;
  for (local_34 = 0; local_34 < 0x20; local_34 = local_34 + 1) {
    *(uint *)((long)__s + (long)local_34 * 4 + 0x1e0) =
         *(uint *)((long)__s + (long)local_34 * 4 + 0x1e0) & 0xffffff00 |
         (uint)*(byte *)((long)hal + (long)(local_34 * 4 + 3) + 0x1f8);
    *(uint *)((long)__s + (long)local_34 * 4 + 0x1e0) =
         *(uint *)((long)__s + (long)local_34 * 4 + 0x1e0) & 0xffff00ff |
         (uint)*(byte *)((long)hal + (long)(local_34 * 4 + 2) + 0x1f8) << 8;
    *(uint *)((long)__s + (long)local_34 * 4 + 0x1e0) =
         *(uint *)((long)__s + (long)local_34 * 4 + 0x1e0) & 0xff00ffff |
         (uint)*(byte *)((long)hal + (long)(local_34 * 4 + 1) + 0x1f8) << 0x10;
    *(uint *)((long)__s + (long)local_34 * 4 + 0x1e0) =
         *(uint *)((long)__s + (long)local_34 * 4 + 0x1e0) & 0xffffff |
         (uint)*(byte *)((long)hal + (long)(local_34 << 2) + 0x1f8) << 0x18;
    *(uint *)((long)__s + (long)(local_34 + 0x20) * 4 + 0x1e0) =
         *(uint *)((long)__s + (long)(local_34 + 0x20) * 4 + 0x1e0) & 0xffffff00 |
         (uint)*(byte *)((long)hal + (long)(local_34 * 4 + 3) + 0x278);
    *(uint *)((long)__s + (long)(local_34 + 0x20) * 4 + 0x1e0) =
         *(uint *)((long)__s + (long)(local_34 + 0x20) * 4 + 0x1e0) & 0xffff00ff |
         (uint)*(byte *)((long)hal + (long)(local_34 * 4 + 2) + 0x278) << 8;
    *(uint *)((long)__s + (long)(local_34 + 0x20) * 4 + 0x1e0) =
         *(uint *)((long)__s + (long)(local_34 + 0x20) * 4 + 0x1e0) & 0xff00ffff |
         (uint)*(byte *)((long)hal + (long)(local_34 * 4 + 1) + 0x278) << 0x10;
    *(uint *)((long)__s + (long)(local_34 + 0x20) * 4 + 0x1e0) =
         *(uint *)((long)__s + (long)(local_34 + 0x20) * 4 + 0x1e0) & 0xffffff |
         (uint)*(byte *)((long)hal + (long)(local_34 << 2) + 0x278) << 0x18;
  }
  *(uint *)((long)__s + 0x19c) = *(uint *)((long)__s + 0x19c) & 0xfffffffe | 1;
  return MPP_OK;
}

Assistant:

static MPP_RET vp8e_vpu_frame_start(void *hal)
{
    RK_S32 i;
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;
    Vp8eHwCfg *hw_cfg = &ctx->hw_cfg;
    Vp8eVepu2Reg_t *regs = (Vp8eVepu2Reg_t *)ctx->regs;

    memset(regs, 0, sizeof(Vp8eVepu2Reg_t));

    regs->sw109.val = hw_cfg->irq_disable ? (regs->sw109.val | 0x0100) :
                      (regs->sw109.val & 0xfeff);

    //((0 & (255)) << 24) | ((0 & (255)) << 16) | ((16 & (63)) << 8) | ((0 & (1)) << 2) | ((0 & (1)) << 1);
    regs->sw54.val = 0x1000;

    if (hw_cfg->input_format < INPUT_RGB565) {
        regs->sw105.val = 0xfc000000;
    } else if (hw_cfg->input_format < INPUT_RGB888) {
        regs->sw105.val = 0xfc000000;
    } else {
        regs->sw105.val = 0x3c000000;
    }

    regs->sw77.base_stream =  hw_cfg->output_strm_base;
    mpp_dev_set_reg_offset(ctx->dev, 77, hw_cfg->output_strm_offset);
    regs->sw78.base_control =  hw_cfg->size_tbl_base;
    regs->sw74.nal_size_write =  hw_cfg->size_tbl_base != 0;
    regs->sw109.mv_write =  hw_cfg->mv_output_base != 0;

    regs->sw56.base_ref_lum = hw_cfg->internal_img_lum_base_r[0];
    regs->sw57.base_ref_chr = hw_cfg->internal_img_chr_base_r[0];
    regs->sw63.base_rec_lum = hw_cfg->internal_img_lum_base_w;
    regs->sw64.base_rec_chr = hw_cfg->internal_img_chr_base_w;

    regs->sw48.base_in_lum = hw_cfg->input_lum_base;
    if (hw_cfg->input_lum_offset)
        mpp_dev_set_reg_offset(ctx->dev, 48, hw_cfg->input_lum_offset);

    regs->sw49.base_in_cb = hw_cfg->input_cb_base;
    if (hw_cfg->input_cb_offset)
        mpp_dev_set_reg_offset(ctx->dev, 49, hw_cfg->input_cb_offset);

    regs->sw50.base_in_cr = hw_cfg->input_cr_base;
    if (hw_cfg->input_cr_offset)
        mpp_dev_set_reg_offset(ctx->dev, 50, hw_cfg->input_cr_offset);

    // regs->sw109.int_timeout =  1 & 1;
    regs->sw109.val |= 0x0400;
    regs->sw109.int_slice_ready =  hw_cfg->int_slice_ready;
    regs->sw109.rec_write_disable =  hw_cfg->rec_write_disable;
    regs->sw103.width =  hw_cfg->mbs_in_row;
    regs->sw103.height =  hw_cfg->mbs_in_col;
    regs->sw103.picture_type =  hw_cfg->frame_coding_type;
    regs->sw103.encoding_mode =  hw_cfg->coding_type;

    regs->sw61.chr_offset = hw_cfg->input_chroma_base_offset;
    regs->sw61.lum_offset = hw_cfg->input_luma_base_offset;
    regs->sw61.row_length = hw_cfg->pixels_on_row;
    regs->sw60.x_fill = hw_cfg->x_fill;
    regs->sw60.y_fill = hw_cfg->y_fill;
    regs->sw74.input_format = hw_cfg->input_format;
    regs->sw74.input_rot = hw_cfg->input_rotation;

    regs->sw59.cabac_enable = hw_cfg->enable_cabac;
    regs->sw75.ip_intra_16_favor = hw_cfg->intra_16_favor;
    regs->sw75.inter_favor = hw_cfg->inter_favor;
    regs->sw59.disable_qp_mv = hw_cfg->disable_qp_mv;
    regs->sw59.deblocking = hw_cfg->filter_disable;
    regs->sw60.skip_penalty = hw_cfg->skip_penalty;
    regs->sw99.split_mv = hw_cfg->split_mv_mode;
    regs->sw107.split_penalty_16x8 = hw_cfg->split_penalty[0];
    regs->sw107.split_penalty_8x8 = hw_cfg->split_penalty[1];
    regs->sw107.split_penalty_8x4 = hw_cfg->split_penalty[2];
    regs->sw102.split_penalty_4x4 = hw_cfg->split_penalty[3];
    regs->sw102.zero_mv_favor = hw_cfg->zero_mv_favor;

    regs->sw51.strm_hdr_rem1 =  hw_cfg->strm_start_msb;
    regs->sw52.strm_hdr_rem2 =  hw_cfg->strm_start_lsb;
    regs->sw53.strm_buf_limit =  hw_cfg->output_strm_size;

    regs->sw76.base_ref_lum2 =  hw_cfg->internal_img_lum_base_r[1];
    regs->sw106.base_ref_chr2 =  hw_cfg->internal_img_chr_base_r[1];

    regs->sw100.y1_quant_dc =  hw_cfg->y1_quant_dc[0];
    regs->sw65.y1_quant_ac =  hw_cfg->y1_quant_ac[0];
    regs->sw66.y2_quant_dc =  hw_cfg->y2_quant_dc[0];
    regs->sw67.y2_quant_ac =  hw_cfg->y2_quant_ac[0];
    regs->sw68.ch_quant_dc =  hw_cfg->ch_quant_dc[0];
    regs->sw69.ch_quant_ac =  hw_cfg->ch_quant_ac[0];

    regs->sw100.y1_zbin_dc =  hw_cfg->y1_zbin_dc[0];
    regs->sw65.y1_zbin_ac =  hw_cfg->y1_zbin_ac[0];
    regs->sw66.y2_zbin_dc =  hw_cfg->y2_zbin_dc[0];
    regs->sw67.y2_zbin_ac =  hw_cfg->y2_zbin_ac[0];
    regs->sw68.ch_zbin_dc =  hw_cfg->ch_zbin_dc[0];
    regs->sw69.ch_zbin_ac =  hw_cfg->ch_zbin_ac[0];

    regs->sw100.y1_round_dc =  hw_cfg->y1_round_dc[0];
    regs->sw65.y1_round_ac =  hw_cfg->y1_round_ac[0];
    regs->sw66.y2_round_dc =  hw_cfg->y2_round_dc[0];
    regs->sw67.y2_round_ac =  hw_cfg->y2_round_ac[0];
    regs->sw68.ch_round_dc =  hw_cfg->ch_round_dc[0];
    regs->sw69.ch_round_ac =  hw_cfg->ch_round_ac[0];

    regs->sw70.y1_dequant_dc =  hw_cfg->y1_dequant_dc[0];
    regs->sw70.y1_dequant_ac =  hw_cfg->y1_dequant_ac[0];
    regs->sw70.y2_dequant_dc =  hw_cfg->y2_dequant_dc[0];
    regs->sw71.y2_dequant_ac =  hw_cfg->y2_dequant_ac[0];
    regs->sw71.ch_dequant_dc =  hw_cfg->ch_dequant_dc[0];
    regs->sw71.ch_dequant_ac =  hw_cfg->ch_dequant_ac[0];

    regs->sw70.mv_ref_idx =  hw_cfg->mv_ref_idx[0];
    regs->sw71.mv_ref_idx2 =  hw_cfg->mv_ref_idx[1];
    regs->sw71.ref2_enable =  hw_cfg->ref2_enable;

    regs->sw72.bool_enc_value =  hw_cfg->bool_enc_value;
    regs->sw73.bool_enc_value_bits =  hw_cfg->bool_enc_value_bits;
    regs->sw73.bool_enc_range =  hw_cfg->bool_enc_range;

    regs->sw73.filter_level =  hw_cfg->filter_level[0];
    regs->sw73.golden_penalty =  hw_cfg->golden_penalty;
    regs->sw73.filter_sharpness =  hw_cfg->filter_sharpness;
    regs->sw73.dct_partition_count =  hw_cfg->dct_partitions;

    regs->sw60.start_offset =  hw_cfg->first_free_bit;

    regs->sw79.base_next_lum =  hw_cfg->vs_next_luma_base;
    regs->sw94.stab_mode =  hw_cfg->vs_mode;

    regs->sw99.dmv_penalty_4p =  hw_cfg->diff_mv_penalty[0];
    regs->sw99.dmv_penalty_1p =  hw_cfg->diff_mv_penalty[1];
    regs->sw99.dmv_penalty_qp =  hw_cfg->diff_mv_penalty[2];

    regs->sw81.base_cabac_ctx =  hw_cfg->cabac_tbl_base;
    regs->sw80.base_mv_write =  hw_cfg->mv_output_base;

    regs->sw95.rgb_coeff_a =  hw_cfg->rgb_coeff_a;
    regs->sw95.rgb_coeff_b =  hw_cfg->rgb_coeff_b;
    regs->sw96.rgb_coeff_c =  hw_cfg->rgb_coeff_c;
    regs->sw96.rgb_coeff_e =  hw_cfg->rgb_coeff_e;
    regs->sw97.rgb_coeff_f =  hw_cfg->rgb_coeff_f;

    regs->sw98.r_mask_msb =  hw_cfg->r_mask_msb;
    regs->sw98.g_mask_msb =  hw_cfg->g_mask_msb;
    regs->sw98.b_mask_msb =  hw_cfg->b_mask_msb;

    regs->sw47.cir_start =  hw_cfg->cir_start;
    regs->sw47.cir_interval =  hw_cfg->cir_interval;

    regs->sw46.intra_area_left =  hw_cfg->intra_area_left;
    regs->sw46.intra_area_right =  hw_cfg->intra_area_right;
    regs->sw46.intra_area_top =  hw_cfg->intra_area_top;
    regs->sw46.intra_area_bottom =  hw_cfg->intra_area_bottom   ;
    regs->sw82.roi1_left =  hw_cfg->roi1_left;
    regs->sw82.roi1_right =  hw_cfg->roi1_right;
    regs->sw82.roi1_top =  hw_cfg->roi1_top;
    regs->sw82.roi1_bottom =  hw_cfg->roi1_bottom;

    regs->sw83.roi2_left =  hw_cfg->roi2_left;
    regs->sw83.roi2_right =  hw_cfg->roi2_right;
    regs->sw83.roi2_top =  hw_cfg->roi2_top;
    regs->sw83.roi2_bottom =  hw_cfg->roi2_bottom;

    regs->sw44.base_partition1 =  hw_cfg->partition_Base[0];
    mpp_dev_set_reg_offset(ctx->dev, 44, hw_cfg->partition_offset[0]);
    regs->sw45.base_partition2 =  hw_cfg->partition_Base[1];
    mpp_dev_set_reg_offset(ctx->dev, 45, hw_cfg->partition_offset[1]);
    regs->sw108.base_prob_count =  hw_cfg->prob_count_base;

    regs->sw33.mode0_penalty =  hw_cfg->intra_mode_penalty[0];
    regs->sw33.mode1_penalty =  hw_cfg->intra_mode_penalty[1];
    regs->sw34.mode2_penalty =  hw_cfg->intra_mode_penalty[2];
    regs->sw34.mode3_penalty =  hw_cfg->intra_mode_penalty[3];

    for (i = 0 ; i < 5; i++) {
        regs->sw28_32[i].b_mode_0_penalty = hw_cfg->intra_b_mode_penalty[2 * i];
        regs->sw28_32[i].b_mode_1_penalty = hw_cfg->intra_b_mode_penalty[2 * i + 1];
    }

    regs->sw71.segment_enable =  hw_cfg->segment_enable;
    regs->sw71.segment_map_update =  hw_cfg->segment_map_update;
    regs->sw27.base_segment_map =  hw_cfg->segment_map_base;

    for (i = 0; i < 3; i++) {
        regs->sw0_26[0 + i * 9].num_0.y1_quant_dc = hw_cfg->y1_quant_dc[1 + i];
        regs->sw0_26[0 + i * 9].num_0.y2_quant_dc = hw_cfg->y2_quant_dc[1 + i];

        regs->sw0_26[1 + i * 9].num_1.ch_quant_dc = hw_cfg->ch_quant_dc[1 + i];
        regs->sw0_26[1 + i * 9].num_1.y1_quant_ac = hw_cfg->y1_quant_ac[1 + i];

        regs->sw0_26[2 + i * 9].num_2.y2_quant_ac = hw_cfg->y2_quant_ac[1 + i];
        regs->sw0_26[2 + i * 9].num_2.ch_quant_ac = hw_cfg->ch_quant_ac[1 + i];

        regs->sw0_26[3 + i * 9].num_3.y1_zbin_dc = hw_cfg->y1_zbin_dc[1 + i];
        regs->sw0_26[3 + i * 9].num_3.y2_zbin_dc = hw_cfg->y2_zbin_dc[1 + i];
        regs->sw0_26[3 + i * 9].num_3.ch_zbin_dc = hw_cfg->ch_zbin_dc[1 + i];

        regs->sw0_26[4 + i * 9].num_4.y1_zbin_ac = hw_cfg->y1_zbin_ac[1 + i];
        regs->sw0_26[4 + i * 9].num_4.y2_zbin_ac = hw_cfg->y2_zbin_ac[1 + i];
        regs->sw0_26[4 + i * 9].num_4.ch_zbin_ac = hw_cfg->ch_zbin_ac[1 + i];

        regs->sw0_26[5 + i * 9].num_5.y1_round_dc = hw_cfg->y1_round_dc[1 + i];
        regs->sw0_26[5 + i * 9].num_5.y2_round_dc = hw_cfg->y2_round_dc[1 + i];
        regs->sw0_26[5 + i * 9].num_5.ch_round_dc = hw_cfg->ch_round_dc[1 + i];

        regs->sw0_26[6 + i * 9].num_6.y1_round_ac = hw_cfg->y1_round_ac[1 + i];
        regs->sw0_26[6 + i * 9].num_6.y2_round_ac = hw_cfg->y2_round_ac[1 + i];
        regs->sw0_26[6 + i * 9].num_6.ch_round_ac = hw_cfg->ch_round_ac[1 + i];

        regs->sw0_26[7 + i * 9].num_7.y1_dequant_dc = hw_cfg->y1_dequant_dc[1 + i];
        regs->sw0_26[7 + i * 9].num_7.y2_dequant_dc = hw_cfg->y2_dequant_dc[1 + i];
        regs->sw0_26[7 + i * 9].num_7.ch_dequant_dc = hw_cfg->ch_dequant_dc[1 + i];
        regs->sw0_26[7 + i * 9].num_7.filter_level = hw_cfg->filter_level[1 + i];

        regs->sw0_26[8 + i * 9].num_8.y1_dequant_ac = hw_cfg->y1_dequant_ac[1 + i];
        regs->sw0_26[8 + i * 9].num_8.y2_dequant_ac = hw_cfg->y2_dequant_ac[1 + i];
        regs->sw0_26[8 + i * 9].num_8.ch_dequant_ac = hw_cfg->ch_dequant_ac[1 + i];
    }

    regs->sw40.lf_ref_delta0 =  hw_cfg->lf_ref_delta[0] & mask_7b;
    regs->sw42.lf_ref_delta1 =  hw_cfg->lf_ref_delta[1] & mask_7b;
    regs->sw42.lf_ref_delta2 =  hw_cfg->lf_ref_delta[2] & mask_7b;
    regs->sw42.lf_ref_delta3 =  hw_cfg->lf_ref_delta[3] & mask_7b;
    regs->sw40.lf_mode_delta0 =  hw_cfg->lf_mode_delta[0] & mask_7b;
    regs->sw43.lf_mode_delta1 =  hw_cfg->lf_mode_delta[1] & mask_7b;
    regs->sw43.lf_mode_delta2 =  hw_cfg->lf_mode_delta[2] & mask_7b;
    regs->sw43.lf_mode_delta3 =  hw_cfg->lf_mode_delta[3] & mask_7b;

    RK_S32 j = 0;
    for (j = 0; j < 32; j++) {
        regs->sw120_183[j].penalty_0 = hw_cfg->dmv_penalty[j * 4 + 3];
        regs->sw120_183[j].penalty_1 = hw_cfg->dmv_penalty[j * 4 + 2];
        regs->sw120_183[j].penalty_2 = hw_cfg->dmv_penalty[j * 4 + 1];
        regs->sw120_183[j].penalty_3 = hw_cfg->dmv_penalty[j * 4];

        regs->sw120_183[j + 32].penalty_0 = hw_cfg->dmv_qpel_penalty[j * 4 + 3];
        regs->sw120_183[j + 32].penalty_1 = hw_cfg->dmv_qpel_penalty[j * 4 + 2];
        regs->sw120_183[j + 32].penalty_2 = hw_cfg->dmv_qpel_penalty[j * 4 + 1];
        regs->sw120_183[j + 32].penalty_3 = hw_cfg->dmv_qpel_penalty[j * 4];
    }

    regs->sw103.enable = 0x1;

    return MPP_OK;
}